

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

float If_CutEdgeRefed(If_Man_t *p,If_Cut_t *pCut)

{
  float fVar1;
  float fVar2;
  
  if (*(uint *)&pCut->field_0x1c < 0x2000000) {
    fVar1 = (float)(*(uint *)&pCut->field_0x1c >> 0x18);
  }
  else {
    fVar2 = If_CutEdgeDeref(p,pCut);
    fVar1 = If_CutEdgeRef(p,pCut);
    if (fVar1 <= fVar2 - p->fEpsilon) {
      __assert_fail("aResult > aResult2 - p->fEpsilon",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifCut.c"
                    ,0x4d1,"float If_CutEdgeRefed(If_Man_t *, If_Cut_t *)");
    }
    if (fVar2 + p->fEpsilon <= fVar1) {
      __assert_fail("aResult < aResult2 + p->fEpsilon",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifCut.c"
                    ,0x4d2,"float If_CutEdgeRefed(If_Man_t *, If_Cut_t *)");
    }
  }
  return fVar1;
}

Assistant:

float If_CutEdgeRefed( If_Man_t * p, If_Cut_t * pCut )
{
    float aResult, aResult2;
    if ( pCut->nLeaves < 2 )
        return pCut->nLeaves;
    aResult2 = If_CutEdgeDeref( p, pCut );
    aResult  = If_CutEdgeRef( p, pCut );
    assert( aResult > aResult2 - p->fEpsilon );
    assert( aResult < aResult2 + p->fEpsilon );
    return aResult;
}